

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O0

void __thiscall KDReports::ImageElement::ImageElement(ImageElement *this,ImageElement *other)

{
  ImageElementPrivate *this_00;
  type pIVar1;
  ImageElement *other_local;
  ImageElement *this_local;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ImageElement_001c8318;
  this_00 = (ImageElementPrivate *)operator_new(0x58);
  pIVar1 = std::
           unique_ptr<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
           ::operator*(&other->d);
  ImageElementPrivate::ImageElementPrivate(this_00,pIVar1);
  std::
  unique_ptr<KDReports::ImageElementPrivate,std::default_delete<KDReports::ImageElementPrivate>>::
  unique_ptr<std::default_delete<KDReports::ImageElementPrivate>,void>
            ((unique_ptr<KDReports::ImageElementPrivate,std::default_delete<KDReports::ImageElementPrivate>>
              *)&this->d,this_00);
  return;
}

Assistant:

KDReports::ImageElement::ImageElement(const ImageElement &other)
    : Element(other)
    , d(new ImageElementPrivate(*other.d))
{
}